

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
identifier_classification::operator<<
          (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,word_class c)

{
  word_class c_local;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os_local;
  
  switch(c) {
  case none:
    os_local = std::operator<<(os,"none");
    break;
  case keyword:
    os_local = std::operator<<(os,"keyword");
    break;
  case reserved:
    os_local = std::operator<<(os,"reserved");
    break;
  case strict:
    os_local = std::operator<<(os,"strict");
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_parser.cpp"
                  ,0x20c,
                  "std::basic_ostream<CharT> &identifier_classification::operator<<(std::basic_ostream<CharT> &, word_class) [CharT = wchar_t]"
                 );
  }
  return os_local;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, word_class c) {
    switch (c) {
    case none:      return os << "none";
    case keyword:   return os << "keyword";
    case reserved:  return os << "reserved";
    case strict:    return os << "strict";
    }
    assert(false);
    return os << "word_class{" << static_cast<int>(c) << "}";
}